

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsizegrip.cpp
# Opt level: O1

Corner __thiscall QSizeGripPrivate::corner(QSizeGripPrivate *this)

{
  uint uVar1;
  QWidget *this_00;
  QWidget *parent;
  QWidgetData *pQVar2;
  Corner CVar3;
  QPoint QVar4;
  int iVar5;
  long in_FS_OFFSET;
  QPoint local_18;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
  parent = this_00;
  while (((parent != (QWidget *)0x0 &&
          (uVar1 = (parent->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
                   super_QFlagsStorage<Qt::WindowType>.i, (uVar1 & 1) == 0)) &&
         ((uVar1 & 0xff) != 0x12))) {
    parent = *(QWidget **)(*(long *)&parent->field_0x8 + 0x10);
  }
  local_18.xp.m_i = 0;
  local_18.yp.m_i = 0;
  QVar4 = QWidget::mapTo(this_00,parent,&local_18);
  pQVar2 = parent->data;
  iVar5 = (pQVar2->crect).y2.m_i - (pQVar2->crect).y1.m_i;
  uVar1 = (uint)((iVar5 - (iVar5 + 1 >> 0x1f)) + 1 >> 1 <= QVar4.yp.m_i.m_i);
  iVar5 = (pQVar2->crect).x2.m_i - (pQVar2->crect).x1.m_i;
  CVar3 = uVar1 * 2 + TopRightCorner;
  if (QVar4.xp.m_i.m_i <= (iVar5 - (iVar5 + 1 >> 0x1f)) + 1 >> 1) {
    CVar3 = uVar1 * 2;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return CVar3;
  }
  __stack_chk_fail();
}

Assistant:

Qt::Corner QSizeGripPrivate::corner() const
{
    Q_Q(const QSizeGrip);
    QWidget *tlw = qt_sizegrip_topLevelWidget(const_cast<QSizeGrip *>(q));
    const QPoint sizeGripPos = q->mapTo(tlw, QPoint(0, 0));
    bool isAtBottom = sizeGripPos.y() >= tlw->height() / 2;
    bool isAtLeft = sizeGripPos.x() <= tlw->width() / 2;
    if (isAtLeft)
        return isAtBottom ? Qt::BottomLeftCorner : Qt::TopLeftCorner;
    else
        return isAtBottom ? Qt::BottomRightCorner : Qt::TopRightCorner;
}